

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_ISB(DisasContext_conflict1 *s,arg_ISB *a)

{
  ulong uVar1;
  
  uVar1 = s->features;
  if ((uVar1 & 0x220) != 0) {
    gen_goto_tb(s,0,(s->base).pc_next);
  }
  return (uVar1 & 0x220) != 0;
}

Assistant:

static bool trans_ISB(DisasContext *s, arg_ISB *a)
{
    if (!ENABLE_ARCH_7 && !arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    /*
     * We need to break the TB after this insn to execute
     * self-modifying code correctly and also to take
     * any pending interrupts immediately.
     */
    gen_goto_tb(s, 0, s->base.pc_next);
    return true;
}